

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O1

mcmcxdef *
mcmcini(mcmcx1def *globalctx,uint pages,_func_void_void_ptr_mclhd_uchar_ptr_ushort *loadfn,
       void *loadctx,_func_void_void_ptr_mcmon *revertfn,void *revertctx)

{
  mcmcxdef *pmVar1;
  
  pmVar1 = (mcmcxdef *)
           mchalo(globalctx->mcmcxerr,(ulong)((int)((ulong)pages << 3) + 0x30U & 0xffff),
                  "mcm client context");
  pmVar1->mcmcxmsz = pages;
  pmVar1->mcmcxgl = globalctx;
  pmVar1->mcmcxldf = loadfn;
  pmVar1->mcmcxldc = loadctx;
  pmVar1->mcmcxrvf = revertfn;
  pmVar1->mcmcxrvc = revertctx;
  pmVar1->mcmcxflg = 0;
  memset(pmVar1->mcmcxmtb,0,(ulong)pages << 3);
  return pmVar1;
}

Assistant:

mcmcxdef *mcmcini(mcmcx1def *globalctx, uint pages,
                  void (*loadfn)(void *, mclhd, uchar *, ushort),
                  void *loadctx,
                  void (*revertfn)(void *, mcmon), void *revertctx)
{
    mcmcxdef *ret;
    ushort    siz;
    
    siz = sizeof(mcmcxdef) + sizeof(mcmon *) * (pages - 1);
    IF_DEBUG(siz += sizeof(ulong));
    
    ret = (mcmcxdef *)mchalo(globalctx->mcmcxerr, siz, "mcm client context");
    IF_DEBUG((*(ulong *)ret = 0x02020202,
              ret = (mcmcxdef *)((uchar *)ret + sizeof(ulong))));

    ret->mcmcxmsz = pages;
    ret->mcmcxgl = globalctx;
    ret->mcmcxldf = loadfn;
    ret->mcmcxldc = loadctx;
    ret->mcmcxrvf = revertfn;
    ret->mcmcxrvc = revertctx;
    ret->mcmcxflg = 0;
    memset(ret->mcmcxmtb, 0, (size_t)(pages * sizeof(mcmon *)));
    return(ret);
}